

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::DefaultPropertyCaseItemSyntax::setChild
          (DefaultPropertyCaseItemSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_004801d8 + *(int *)(&DAT_004801d8 + index * 4)))();
  return;
}

Assistant:

void DefaultPropertyCaseItemSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: defaultKeyword = child.token(); return;
        case 1: colon = child.token(); return;
        case 2: expr = child.node() ? &child.node()->as<PropertyExprSyntax>() : nullptr; return;
        case 3: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}